

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

LBBox3fa * __thiscall embree::SceneGraph::GridMeshNode::lbounds(GridMeshNode *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  size_type sVar4;
  long in_RSI;
  LBBox3fa *in_RDI;
  float fVar5;
  Vec3fa *x;
  const_iterator __end3;
  const_iterator __begin3;
  value_type *__range3;
  BBox3fa b;
  size_t t;
  avector<BBox3fa> bboxes;
  size_t i;
  size_t i_1;
  size_t i_2;
  void *in_stack_fffffffffffffca8;
  size_t in_stack_fffffffffffffcb0;
  size_t in_stack_fffffffffffffcb8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_2f0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  ulong local_2b8;
  ulong uStack_2b0;
  ulong local_2a0;
  undefined1 local_298 [8];
  ulong local_290;
  ulong local_288;
  void *local_280;
  undefined8 *local_268;
  undefined8 *local_260;
  float local_258;
  float fStack_254;
  float in_stack_fffffffffffffdb0;
  float in_stack_fffffffffffffdb4;
  float in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdbc;
  ulong local_208;
  ulong uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_1e0;
  undefined8 *local_1d8;
  ulong *local_1d0;
  ulong *local_1c8;
  undefined8 *local_1c0;
  undefined8 *local_1b8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_1b0;
  undefined8 *local_1a8;
  undefined8 *local_1a0;
  undefined1 local_198 [16];
  undefined8 *local_188;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_180;
  ulong *local_178;
  ulong *local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  ulong local_158;
  ulong uStack_150;
  undefined1 local_148 [16];
  ulong *local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  size_type local_100;
  undefined1 *local_f8;
  size_type local_f0;
  undefined1 *local_e8;
  undefined8 *local_e0;
  undefined8 *local_d8;
  ulong *local_d0;
  ulong *local_c8;
  undefined8 *local_c0;
  undefined8 *local_b8;
  undefined1 *local_b0;
  ulong local_a0;
  ulong local_98;
  undefined1 *local_90;
  size_type local_88;
  undefined1 *local_80;
  void *local_78;
  void *local_70;
  long local_68;
  ulong local_50;
  undefined1 *local_48;
  ulong local_40;
  void *local_38;
  undefined1 *local_30;
  const_reference local_10;
  const_reference local_8;
  
  local_100 = std::
              vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
              ::size((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                      *)(in_RSI + 0x70));
  local_f8 = local_298;
  local_290 = 0;
  local_288 = 0;
  local_280 = (void *)0x0;
  local_98 = local_100;
  local_90 = local_f8;
  if (local_100 != 0) {
    local_88 = local_100;
    local_80 = local_f8;
    local_280 = alignedMalloc(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
    for (local_a0 = 0; local_a0 < local_98; local_a0 = local_a0 + 1) {
      local_78 = (void *)((long)local_280 + local_a0 * 0x20);
      local_68 = (long)local_78 + 0x10;
      local_70 = local_78;
    }
    local_288 = local_98;
  }
  local_290 = local_288;
  for (local_2a0 = 0; uVar3 = local_2a0,
      sVar4 = std::
              vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
              ::size((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                      *)(in_RSI + 0x70)), uVar3 < sVar4; local_2a0 = local_2a0 + 1) {
    local_268 = &local_2c8;
    local_260 = local_268;
    local_258 = std::numeric_limits<float>::infinity();
    local_2c8 = CONCAT44(local_258,local_258);
    uStack_2c0 = CONCAT44(local_258,local_258);
    fStack_254 = local_258;
    in_stack_fffffffffffffdb0 = local_258;
    in_stack_fffffffffffffdb4 = local_258;
    in_stack_fffffffffffffdb8 = local_258;
    fVar5 = std::numeric_limits<float>::infinity();
    local_2b8 = CONCAT44(fVar5,fVar5) ^ 0x8000000080000000;
    uStack_2b0 = CONCAT44(fVar5,fVar5) ^ 0x8000000080000000;
    local_10 = std::
               vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
               ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                             *)(in_RSI + 0x70),local_2a0);
    for (local_2f0 = &local_10->items->field_0;
        local_2f0 != &local_10->items[local_10->size_active].field_0; local_2f0 = local_2f0 + 1) {
      local_1d8 = &local_2c8;
      local_1e0 = local_2f0;
      local_1a0 = &local_1f8;
      local_1b0 = local_2f0;
      local_118 = local_2c8;
      uStack_110 = uStack_2c0;
      auVar1._8_8_ = uStack_2c0;
      auVar1._0_8_ = local_2c8;
      local_128 = *(undefined8 *)local_2f0;
      uStack_120 = *(undefined8 *)(local_2f0->m128 + 2);
      local_198 = minps(auVar1,(undefined1  [16])*(__m128 *)local_2f0);
      local_188 = &local_1f8;
      local_1f8 = local_198._0_8_;
      uStack_1f0 = local_198._8_8_;
      local_1c0 = &local_1f8;
      local_2c8 = local_198._0_8_;
      uStack_2c0 = local_198._8_8_;
      local_178 = &local_2b8;
      local_170 = &local_208;
      local_180 = local_2f0;
      local_158 = local_2b8;
      uStack_150 = uStack_2b0;
      auVar2._8_8_ = uStack_2b0;
      auVar2._0_8_ = local_2b8;
      local_168 = *(undefined8 *)local_2f0;
      uStack_160 = *(undefined8 *)(local_2f0->m128 + 2);
      local_148 = maxps(auVar2,(undefined1  [16])*(__m128 *)local_2f0);
      local_130 = &local_208;
      local_208 = local_148._0_8_;
      uStack_200 = local_148._8_8_;
      local_1c8 = &local_2b8;
      local_1d0 = &local_208;
      local_2b8 = local_148._0_8_;
      uStack_2b0 = local_148._8_8_;
      local_1b8 = local_1d8;
      local_1a8 = local_1d8;
    }
    local_f0 = local_2a0;
    local_e8 = local_298;
    local_d8 = (undefined8 *)((long)local_280 + local_2a0 * 0x20);
    local_e0 = &local_2c8;
    *local_d8 = local_2c8;
    local_d8[1] = uStack_2c0;
    local_d0 = &local_2b8;
    local_c8 = local_d8 + 2;
    *local_c8 = local_2b8;
    local_d8[3] = uStack_2b0;
    local_c0 = local_e0;
    local_b8 = local_d8;
    local_8 = local_10;
  }
  LBBox<embree::Vec3fa>::LBBox
            ((LBBox<embree::Vec3fa> *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
             (avector<BBox<Vec3fa>_> *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0)
            );
  local_b0 = local_298;
  for (local_50 = 0; local_50 < local_290; local_50 = local_50 + 1) {
  }
  local_40 = local_288;
  local_38 = local_280;
  local_48 = local_b0;
  local_30 = local_b0;
  alignedFree(in_stack_fffffffffffffca8);
  *(undefined8 *)(local_b0 + 0x18) = 0;
  *(undefined8 *)(local_b0 + 0x10) = 0;
  *(undefined8 *)(local_b0 + 8) = 0;
  return in_RDI;
}

Assistant:

virtual LBBox3fa lbounds() const
      {
        avector<BBox3fa> bboxes(positions.size());
        for (size_t t=0; t<positions.size(); t++) {
          BBox3fa b = empty;
          for (auto& x : positions[t]) b.extend(x);
          bboxes[t] = b;
        }
        return LBBox3fa(bboxes);
      }